

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
::~BruteForceSolver(BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
                    *this)

{
  pointer puVar1;
  
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->covered_cols_).super__Bvector_base<std::allocator<bool>_>);
  puVar1 = (this->optimal_assignment_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->current_assignment_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

BruteForceSolver(const CostFunction& cost_function, const Size num_rows, const Size num_cols,
                   const CostComparator& cost_comparator, const Cost& zero_cost)
    : cost_function_(cost_function), cost_comparator_(cost_comparator), zero_cost_(zero_cost),
      num_rows_(static_cast<std::size_t>(num_rows)), num_cols_(static_cast<std::size_t>(num_cols)),
      current_assignment_(num_rows_, num_cols_), optimal_assignment_(num_rows_, num_cols_),
      covered_cols_(num_cols_, false), optimal_cost_(num_rows_, zero_cost)
  {
  }